

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O1

bool __thiscall DyndepParser::Parse(DyndepParser *this,string *filename,string *input,string *err)

{
  Lexer *this_00;
  StringPiece filename_00;
  StringPiece input_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Token t;
  long *plVar4;
  size_type *psVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  byte unaff_R13B;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  DyndepParser *local_38;
  
  this_00 = &(this->super_Parser).lexer_;
  filename_00.str_ = (filename->_M_dataplus)._M_p;
  filename_00.len_ = filename->_M_string_length;
  input_00.str_ = (input->_M_dataplus)._M_p;
  input_00.len_ = input->_M_string_length;
  local_38 = this;
  Lexer::Start(this_00,filename_00,input_00);
  bVar1 = false;
  do {
    t = Lexer::ReadToken(this_00);
    switch(t) {
    case ERROR:
      Lexer::DescribeLastError_abi_cxx11_(&local_78,this_00);
      unaff_R13B = Lexer::Error(this_00,&local_78,err);
      break;
    case BUILD:
      if (!bVar1) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"expected \'ninja_dyndep_version = ...\'","");
        unaff_R13B = Lexer::Error(this_00,&local_78,err);
        break;
      }
      bVar2 = ParseEdge(local_38,err);
      if (bVar2) goto switchD_00197b4f_caseD_8;
LAB_00197ce1:
      unaff_R13B = false;
      goto LAB_00197dc2;
    case COLON:
    case DEFAULT:
    case EQUALS:
    case INCLUDE:
    case INDENT:
switchD_00197b4f_caseD_2:
      local_58[0] = &local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"unexpected ","");
      Lexer::TokenName(t);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_78.field_2._M_allocated_capacity = *psVar5;
        local_78.field_2._8_8_ = plVar4[3];
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar5;
        local_78._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_78._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      unaff_R13B = Lexer::Error(this_00,&local_78,err);
LAB_00197d88:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar6 = local_48._M_allocated_capacity;
      _Var7._M_p = (pointer)local_58[0];
      if (local_58[0] == &local_48) goto LAB_00197dc2;
      goto LAB_00197dba;
    case IDENT:
      Lexer::UnreadToken(this_00);
      if (bVar1) {
        local_58[0] = &local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"unexpected ","");
        Lexer::TokenName(IDENT);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_78.field_2._M_allocated_capacity = *psVar5;
          local_78.field_2._8_8_ = plVar4[3];
        }
        else {
          local_78.field_2._M_allocated_capacity = *psVar5;
          local_78._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_78._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        unaff_R13B = Lexer::Error(this_00,&local_78,err);
        goto LAB_00197d88;
      }
      bVar3 = ParseDyndepVersion(local_38,err);
      bVar2 = true;
      if (!bVar3) goto LAB_00197ce1;
      goto LAB_00197c13;
    case NEWLINE:
switchD_00197b4f_caseD_8:
      bVar2 = bVar1;
LAB_00197c13:
      bVar3 = true;
      bVar1 = bVar2;
      goto LAB_00197dc4;
    default:
      if (t != TEOF) goto switchD_00197b4f_caseD_2;
      if (bVar1) {
        unaff_R13B = true;
        goto LAB_00197dc2;
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"expected \'ninja_dyndep_version = ...\'","");
      unaff_R13B = Lexer::Error(this_00,&local_78,err);
    }
    uVar6 = local_78.field_2._M_allocated_capacity;
    _Var7._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_00197dba:
      operator_delete(_Var7._M_p,uVar6 + 1);
    }
LAB_00197dc2:
    bVar3 = false;
LAB_00197dc4:
    if (!bVar3) {
      return (bool)(unaff_R13B & 1);
    }
  } while( true );
}

Assistant:

bool DyndepParser::Parse(const string& filename, const string& input,
                         string* err) {
  lexer_.Start(filename, input);

  // Require a supported ninja_dyndep_version value immediately so
  // we can exit before encountering any syntactic surprises.
  bool haveDyndepVersion = false;

  for (;;) {
    Lexer::Token token = lexer_.ReadToken();
    switch (token) {
    case Lexer::BUILD: {
      if (!haveDyndepVersion)
        return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
      if (!ParseEdge(err))
        return false;
      break;
    }
    case Lexer::IDENT: {
      lexer_.UnreadToken();
      if (haveDyndepVersion)
        return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                            err);
      if (!ParseDyndepVersion(err))
        return false;
      haveDyndepVersion = true;
      break;
    }
    case Lexer::ERROR:
      return lexer_.Error(lexer_.DescribeLastError(), err);
    case Lexer::TEOF:
      if (!haveDyndepVersion)
        return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
      return true;
    case Lexer::NEWLINE:
      break;
    default:
      return lexer_.Error(string("unexpected ") + Lexer::TokenName(token),
                          err);
    }
  }
  return false;  // not reached
}